

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hann_window.hpp
# Opt level: O0

void __thiscall re::fft::hann_window<float,_1024L>::encache(hann_window<float,_1024L> *this)

{
  reference pvVar1;
  float fVar2;
  undefined4 local_14;
  int i;
  hann_window<float,_1024L> *this_local;
  
  for (local_14 = 0; local_14 < 0x400; local_14 = local_14 + 1) {
    fVar2 = window_function((long)local_14);
    pvVar1 = std::array<float,_1024UL>::operator[](&this->cache,(long)local_14);
    *pvVar1 = fVar2;
  }
  return;
}

Assistant:

void
    encache()
    noexcept
    {
        for (auto i = 0; i < N; ++i) {
            cache[i] = window_function(i);
        }
    }